

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpTokens.cpp
# Opt level: O1

bool __thiscall
glslang::TPpContext::TokenStream::peekTokenizedPasting(TokenStream *this,bool lastTokenPastes)

{
  pointer pTVar1;
  pointer pTVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = this->currentPos;
  pTVar2 = (this->stream).
           super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
           .
           super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->stream).
                 super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                 .
                 super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
          0x6db6db6db6db6db7;
  bVar6 = uVar5 < uVar4;
  uVar3 = uVar5;
  if (bVar6) {
    if (pTVar2[uVar5].atom == 0x20) {
      pTVar1 = pTVar2 + uVar5;
      do {
        uVar3 = uVar3 + 1;
        pTVar1 = pTVar1 + 1;
        if (uVar4 - uVar3 == 0) {
          this->currentPos = uVar3;
          uVar3 = uVar4;
          goto LAB_004d34de;
        }
      } while (pTVar1->atom == 0x20);
      this->currentPos = uVar3;
      bVar6 = uVar3 < uVar4;
    }
    if ((bVar6) && (pTVar2[uVar3].atom == 0x97)) {
      bVar6 = true;
      uVar3 = uVar5;
      goto LAB_004d3524;
    }
  }
LAB_004d34de:
  if (!lastTokenPastes) {
    return false;
  }
  uVar5 = this->currentPos;
  bVar6 = uVar4 <= uVar5;
  if ((!bVar6) && (pTVar2[uVar5].atom == 0x20)) {
    pTVar2 = pTVar2 + uVar5;
    do {
      uVar5 = uVar5 + 1;
      pTVar2 = pTVar2 + 1;
      if (uVar4 - uVar5 == 0) break;
    } while (pTVar2->atom == 0x20);
    this->currentPos = uVar5;
    bVar6 = uVar4 <= uVar5;
  }
LAB_004d3524:
  this->currentPos = uVar3;
  return bVar6;
}

Assistant:

bool TPpContext::TokenStream::peekTokenizedPasting(bool lastTokenPastes)
{
    // 1. preceding ##?

    size_t savePos = currentPos;
    // skip white space
    while (peekToken(' '))
        ++currentPos;
    if (peekToken(PpAtomPaste)) {
        currentPos = savePos;
        return true;
    }

    // 2. last token and we've been told after this there will be a ##

    if (! lastTokenPastes)
        return false;
    // Getting here means the last token will be pasted, after this

    // Are we at the last non-whitespace token?
    savePos = currentPos;
    bool moreTokens = false;
    do {
        if (atEnd())
            break;
        if (!peekToken(' ')) {
            moreTokens = true;
            break;
        }
        ++currentPos;
    } while (true);
    currentPos = savePos;

    return !moreTokens;
}